

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsDotNetSdkTarget(cmGeneratorTarget *this)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  cmValue local_18;
  cmGeneratorTarget *local_10;
  cmGeneratorTarget *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"DOTNET_SDK",&local_39);
  local_18 = GetProperty(this,&local_38);
  bVar1 = cmValue::IsEmpty(&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool cmGeneratorTarget::IsDotNetSdkTarget() const
{
  return !this->GetProperty("DOTNET_SDK").IsEmpty();
}